

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O3

string * print_current_time_abi_cxx11_(void)

{
  tm *ptVar1;
  ostream *poVar2;
  string *in_RDI;
  Logger local_a4;
  time_t current_time;
  string local_98;
  string local_78;
  tm broken_down_time;
  
  current_time = time((time_t *)0x0);
  ptVar1 = localtime_r(&current_time,(tm *)&broken_down_time);
  if (ptVar1 == (tm *)&broken_down_time) {
    StringPrintf_abi_cxx11_
              (in_RDI,"%04d%02d%02d-%02d%02d%02d",(ulong)(broken_down_time.tm_year + 0x76c),
               (ulong)(broken_down_time.tm_mon + 1),(ulong)(uint)broken_down_time.tm_mday,
               (ulong)(uint)broken_down_time.tm_hour,(ulong)(uint)broken_down_time.tm_min,
               (ulong)(uint)broken_down_time.tm_sec);
    return in_RDI;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_a4.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/system.h",
             "");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"print_current_time","");
  poVar2 = Logger::Start(ERR,&local_78,0x3a,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/system.h",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"localtime_r(&current_time, &broken_down_time) == &broken_down_time",0x42);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  localtime_r(&current_time,(tm *)&broken_down_time);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  Logger::~Logger(&local_a4);
  abort();
}

Assistant:

std::string print_current_time() {
  time_t current_time = time(NULL);
  struct tm broken_down_time;
#ifndef _MSC_VER
  CHECK(localtime_r(&current_time, &broken_down_time) == &broken_down_time);
#else
  CHECK(localtime_s(&broken_down_time, &current_time) == 0);
#endif
  return StringPrintf("%04d%02d%02d-%02d%02d%02d",
                      1900 + broken_down_time.tm_year,
                      1 + broken_down_time.tm_mon,
                      broken_down_time.tm_mday,
                      broken_down_time.tm_hour,
                      broken_down_time.tm_min,
                      broken_down_time.tm_sec);
}